

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicLinearAllocator.hpp
# Opt level: O1

void __thiscall Diligent::DynamicLinearAllocator::Free(DynamicLinearAllocator *this)

{
  pointer pBVar1;
  vector<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
  *__range2;
  Block *block;
  pointer pBVar2;
  
  pBVar1 = (this->m_Blocks).
           super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pBVar2 = (this->m_Blocks).
                super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
                ._M_impl.super__Vector_impl_data._M_start; pBVar2 != pBVar1; pBVar2 = pBVar2 + 1) {
    (*this->m_pAllocator->_vptr_IMemoryAllocator[1])(this->m_pAllocator,pBVar2->Data);
  }
  pBVar2 = (this->m_Blocks).
           super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_Blocks).
      super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
      ._M_impl.super__Vector_impl_data._M_finish != pBVar2) {
    (this->m_Blocks).
    super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
    ._M_impl.super__Vector_impl_data._M_finish = pBVar2;
  }
  this->m_pAllocator = (IMemoryAllocator *)0x0;
  return;
}

Assistant:

void Free()
    {
        for (auto& block : m_Blocks)
        {
            m_pAllocator->Free(block.Data);
        }
        m_Blocks.clear();

        m_pAllocator = nullptr;
    }